

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

size_t __thiscall booster::aio::stream_socket::read_some(stream_socket *this,mutable_buffer *buffer)

{
  error_code eVar1;
  bool bVar2;
  size_t sVar3;
  undefined8 uVar4;
  error_code *in_RDI;
  size_t r;
  error_code e;
  system_error *in_stack_ffffffffffffffc0;
  error_code *in_stack_ffffffffffffffc8;
  mutable_buffer *in_stack_ffffffffffffffd0;
  stream_socket *in_stack_ffffffffffffffd8;
  error_code local_20 [2];
  
  std::error_code::error_code(in_RDI);
  sVar3 = read_some(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  bVar2 = std::error_code::operator_cast_to_bool(local_20);
  if (!bVar2) {
    return sVar3;
  }
  uVar4 = __cxa_allocate_exception(0x40);
  eVar1._M_cat = local_20[0]._M_cat;
  eVar1._M_value = local_20[0]._M_value;
  eVar1._4_4_ = local_20[0]._4_4_;
  system::system_error::system_error(in_stack_ffffffffffffffc0,eVar1);
  __cxa_throw(uVar4,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

size_t stream_socket::read_some(mutable_buffer const &buffer)
{
	system::error_code e;
	size_t r=read_some(buffer,e);
	if(e)
		throw system::system_error(e);
	return r;
}